

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuInterval.cpp
# Opt level: O2

Interval *
tcu::applyMonotone(Interval *__return_storage_ptr__,DoubleFunc2 *func,Interval *arg0,Interval *arg1)

{
  byte bVar1;
  Interval *val_arg_;
  ulong uVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double local_c8;
  ScopedRoundingMode point_ctx_;
  Interval local_58;
  Interval local_40;
  
  bVar1 = false;
  __return_storage_ptr__->m_hasNaN = false;
  *(undefined4 *)&__return_storage_ptr__->m_lo = 0;
  *(undefined4 *)((long)&__return_storage_ptr__->m_lo + 4) = 0x7ff00000;
  *(undefined4 *)&__return_storage_ptr__->m_hi = 0;
  *(undefined4 *)((long)&__return_storage_ptr__->m_hi + 4) = 0xfff00000;
  local_58.m_hasNaN = false;
  local_58.m_lo = INFINITY;
  local_58.m_hi = -INFINITY;
  local_40.m_hasNaN = false;
  local_40.m_lo = INFINITY;
  local_40.m_hi = -INFINITY;
  dVar8 = arg0->m_lo;
  if (dVar8 < arg0->m_hi || dVar8 == arg0->m_hi) {
    dVar10 = arg1->m_lo;
    if (dVar10 < arg1->m_hi || dVar10 == arg1->m_hi) {
      point_ctx_.m_oldMode = deGetRoundingMode();
      deSetRoundingMode(DE_ROUNDINGMODE_TO_NEGATIVE_INF);
      dVar4 = (*func)(dVar8,dVar10);
      dVar9 = dVar4;
      if (NAN(dVar4)) {
        dVar9 = INFINITY;
      }
      deSetRoundingMode(DE_ROUNDINGMODE_TO_POSITIVE_INF);
      dVar5 = (*func)(dVar8,dVar10);
      dVar10 = dVar5;
      if (NAN(dVar5)) {
        dVar10 = INFINITY;
      }
      ScopedRoundingMode::~ScopedRoundingMode(&point_ctx_);
      dVar11 = arg1->m_hi;
      point_ctx_.m_oldMode = deGetRoundingMode();
      deSetRoundingMode(DE_ROUNDINGMODE_TO_NEGATIVE_INF);
      dVar6 = (*func)(dVar8,dVar11);
      dVar3 = dVar6;
      if (NAN(dVar6)) {
        dVar3 = INFINITY;
      }
      deSetRoundingMode(DE_ROUNDINGMODE_TO_POSITIVE_INF);
      dVar7 = (*func)(dVar8,dVar11);
      dVar8 = (double)(~-(ulong)NAN(dVar4) & (ulong)dVar4 | -(ulong)NAN(dVar4) & 0xfff0000000000000)
      ;
      dVar11 = (double)(~-(ulong)NAN(dVar5) & (ulong)dVar5 | -(ulong)NAN(dVar5) & 0xfff0000000000000
                       );
      uVar2 = -(ulong)(dVar11 <= dVar8);
      dVar12 = (double)(-(ulong)(dVar9 <= dVar10) & (ulong)dVar9 |
                       ~-(ulong)(dVar9 <= dVar10) & (ulong)dVar10);
      dVar10 = (double)(uVar2 & (ulong)dVar8 | ~uVar2 & (ulong)dVar11);
      dVar8 = (double)(~-(ulong)NAN(dVar6) & (ulong)dVar6 | -(ulong)NAN(dVar6) & 0xfff0000000000000)
      ;
      dVar9 = dVar7;
      if (NAN(dVar7)) {
        dVar9 = INFINITY;
      }
      dVar11 = (double)(~-(ulong)NAN(dVar7) & (ulong)dVar7 |
                       (ulong)((uint)(-(ulong)NAN(dVar7) >> 0x20) & 0xfff00000) << 0x20);
      local_c8 = (double)(-(ulong)(dVar3 <= dVar9) & (ulong)dVar3 |
                         ~-(ulong)(dVar3 <= dVar9) & (ulong)dVar9);
      uVar2 = -(ulong)(dVar11 <= dVar8);
      dVar8 = (double)(uVar2 & (ulong)dVar8 | ~uVar2 & (ulong)dVar11);
      ScopedRoundingMode::~ScopedRoundingMode(&point_ctx_);
      local_58.m_hasNaN = (bool)((-(NAN(dVar4) || NAN(dVar5)) | -(NAN(dVar6) || NAN(dVar7))) & 1);
      uVar2 = -(ulong)(dVar12 <= local_c8);
      local_58.m_lo = (double)(uVar2 & (ulong)dVar12 | ~uVar2 & (ulong)local_c8);
      uVar2 = -(ulong)(dVar8 <= dVar10);
      local_58.m_hi = (double)(uVar2 & (ulong)dVar10 | ~uVar2 & (ulong)dVar8);
    }
    else {
      local_58.m_hi = -INFINITY;
      local_58.m_lo = INFINITY;
      local_58.m_hasNaN = false;
    }
    if (arg1->m_hasNaN == true) {
      point_ctx_.m_oldMode._0_1_ = 1;
      Interval::operator|=(&local_58,(Interval *)&point_ctx_);
    }
    dVar8 = arg1->m_lo;
    if (dVar8 < arg1->m_hi || dVar8 == arg1->m_hi) {
      dVar10 = arg0->m_hi;
      point_ctx_.m_oldMode = deGetRoundingMode();
      deSetRoundingMode(DE_ROUNDINGMODE_TO_NEGATIVE_INF);
      dVar4 = (*func)(dVar10,dVar8);
      dVar9 = dVar4;
      if (NAN(dVar4)) {
        dVar9 = INFINITY;
      }
      deSetRoundingMode(DE_ROUNDINGMODE_TO_POSITIVE_INF);
      dVar5 = (*func)(dVar10,dVar8);
      dVar8 = dVar5;
      if (NAN(dVar5)) {
        dVar8 = INFINITY;
      }
      ScopedRoundingMode::~ScopedRoundingMode(&point_ctx_);
      dVar11 = arg1->m_hi;
      point_ctx_.m_oldMode = deGetRoundingMode();
      deSetRoundingMode(DE_ROUNDINGMODE_TO_NEGATIVE_INF);
      dVar6 = (*func)(dVar10,dVar11);
      dVar3 = dVar6;
      if (NAN(dVar6)) {
        dVar3 = INFINITY;
      }
      deSetRoundingMode(DE_ROUNDINGMODE_TO_POSITIVE_INF);
      dVar7 = (*func)(dVar10,dVar11);
      dVar10 = (double)(~-(ulong)NAN(dVar4) & (ulong)dVar4 | -(ulong)NAN(dVar4) & 0xfff0000000000000
                       );
      dVar11 = (double)(~-(ulong)NAN(dVar5) & (ulong)dVar5 | -(ulong)NAN(dVar5) & 0xfff0000000000000
                       );
      uVar2 = -(ulong)(dVar11 <= dVar10);
      dVar12 = (double)(-(ulong)(dVar9 <= dVar8) & (ulong)dVar9 |
                       ~-(ulong)(dVar9 <= dVar8) & (ulong)dVar8);
      dVar10 = (double)(uVar2 & (ulong)dVar10 | ~uVar2 & (ulong)dVar11);
      dVar8 = (double)(~-(ulong)NAN(dVar6) & (ulong)dVar6 | -(ulong)NAN(dVar6) & 0xfff0000000000000)
      ;
      dVar9 = dVar7;
      if (NAN(dVar7)) {
        dVar9 = INFINITY;
      }
      dVar11 = (double)(~-(ulong)NAN(dVar7) & (ulong)dVar7 |
                       (ulong)((uint)(-(ulong)NAN(dVar7) >> 0x20) & 0xfff00000) << 0x20);
      local_c8 = (double)(-(ulong)(dVar3 <= dVar9) & (ulong)dVar3 |
                         ~-(ulong)(dVar3 <= dVar9) & (ulong)dVar9);
      uVar2 = -(ulong)(dVar11 <= dVar8);
      dVar8 = (double)(uVar2 & (ulong)dVar8 | ~uVar2 & (ulong)dVar11);
      ScopedRoundingMode::~ScopedRoundingMode(&point_ctx_);
      local_40.m_hasNaN = (bool)((-(NAN(dVar4) || NAN(dVar5)) | -(NAN(dVar6) || NAN(dVar7))) & 1);
      uVar2 = -(ulong)(dVar12 <= local_c8);
      local_40.m_lo = (double)(uVar2 & (ulong)dVar12 | ~uVar2 & (ulong)local_c8);
      uVar2 = -(ulong)(dVar8 <= dVar10);
      local_40.m_hi = (double)(uVar2 & (ulong)dVar10 | ~uVar2 & (ulong)dVar8);
    }
    else {
      local_40.m_lo = INFINITY;
      local_40.m_hi = -INFINITY;
      local_40.m_hasNaN = false;
    }
    if (arg1->m_hasNaN == true) {
      point_ctx_.m_oldMode._0_1_ = 1;
      Interval::operator|=(&local_40,(Interval *)&point_ctx_);
    }
    bVar1 = 1;
    if (local_58.m_hasNaN == false) {
      bVar1 = local_40.m_hasNaN;
    }
    dVar10 = (double)(~-(ulong)(local_58.m_lo <= local_40.m_lo) & (ulong)local_40.m_lo |
                     (ulong)local_58.m_lo & -(ulong)(local_58.m_lo <= local_40.m_lo));
    dVar8 = (double)(~-(ulong)(local_40.m_hi <= local_58.m_hi) & (ulong)local_40.m_hi |
                    (ulong)local_58.m_hi & -(ulong)(local_40.m_hi <= local_58.m_hi));
  }
  else {
    dVar8 = -INFINITY;
    dVar10 = INFINITY;
  }
  __return_storage_ptr__->m_hasNaN = (bool)bVar1;
  __return_storage_ptr__->m_lo = dVar10;
  __return_storage_ptr__->m_hi = dVar8;
  if (arg0->m_hasNaN == true) {
    point_ctx_.m_oldMode._0_1_ = 1;
    Interval::operator|=(__return_storage_ptr__,(Interval *)&point_ctx_);
  }
  return __return_storage_ptr__;
}

Assistant:

Interval applyMonotone (DoubleFunc2& func, const Interval& arg0, const Interval& arg1)
{
	Interval ret;

	TCU_INTERVAL_APPLY_MONOTONE2(ret, x, arg0, y, arg1, val,
								 TCU_SET_INTERVAL(val, point, point = func(x, y)));

	return ret;
}